

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene_points.h
# Opt level: O2

PrimInfoMB * __thiscall
embree::avx::PointsISA::createPrimRefMBArray
          (PrimInfoMB *__return_storage_ptr__,PointsISA *this,mvector<PrimRefMB> *prims,BBox1f *t0t1
          ,range<unsigned_long> *r,size_t k,uint geomID)

{
  RawBufferView *pRVar1;
  float fVar2;
  BBox1f BVar3;
  BufferView<embree::Vec3fx> *pBVar4;
  PrimRefMB *pPVar5;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar6;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar7;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar8;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar9;
  undefined1 auVar10 [16];
  int iVar11;
  undefined1 auVar12 [16];
  uint uVar13;
  uint uVar14;
  ulong *puVar15;
  int iVar16;
  ulong uVar17;
  size_t *psVar18;
  undefined4 uVar19;
  long lVar20;
  ulong uVar21;
  uint index;
  unsigned_long uVar22;
  size_t itime;
  float fVar23;
  float fVar24;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  float fVar27;
  float fVar28;
  float fVar30;
  undefined1 auVar29 [16];
  float fVar34;
  float fVar35;
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  float fVar36;
  undefined1 auVar37 [64];
  undefined1 auVar38 [16];
  float fVar40;
  float fVar41;
  float fVar42;
  undefined1 auVar39 [64];
  undefined1 auVar43 [16];
  float fVar45;
  float fVar46;
  float fVar47;
  undefined1 auVar44 [64];
  undefined1 auVar48 [64];
  undefined1 auVar49 [64];
  undefined1 auVar50 [64];
  undefined1 auVar51 [64];
  undefined1 auVar52 [64];
  undefined1 local_1c8 [16];
  undefined1 local_1b8 [16];
  undefined1 local_1a8 [16];
  undefined1 local_198 [16];
  anon_class_16_2_4e716a3c local_140;
  ulong local_130;
  BBox<embree::Vec3fa> bupper1;
  BBox<embree::Vec3fa> blower0;
  BBox<embree::Vec3fa> bi;
  BBox<embree::Vec3fa> bupper0;
  BBox<embree::Vec3fa> blower1;
  
  (__return_storage_ptr__->object_range)._begin = 0;
  uVar22 = r->_begin;
  local_198 = SUB6416(ZEXT464(0x3f800000),0);
  auVar37 = ZEXT1664(ZEXT816(0x3f80000000000000));
  local_1c8._8_4_ = 0x7f800000;
  local_1c8._0_8_ = 0x7f8000007f800000;
  local_1c8._12_4_ = 0x7f800000;
  auVar44 = ZEXT1664(local_1c8);
  local_1a8._8_4_ = 0xff800000;
  local_1a8._0_8_ = 0xff800000ff800000;
  local_1a8._12_4_ = 0xff800000;
  auVar39 = ZEXT1664(local_1a8);
  uVar17 = 0;
  auVar48 = ZEXT1664(ZEXT816(0) << 0x40);
  auVar49 = ZEXT1664(CONCAT412(0xddccb9a2,CONCAT48(0xddccb9a2,0xddccb9a2ddccb9a2)));
  auVar51 = ZEXT1664(CONCAT412(0x5dccb9a2,CONCAT48(0x5dccb9a2,0x5dccb9a25dccb9a2)));
  auVar50 = ZEXT1664(local_1a8);
  auVar52 = ZEXT1664(local_1c8);
  local_1b8 = ZEXT816(0);
  while( true ) {
    if (r->_end <= uVar22) {
      *(undefined8 *)
       &(__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds0.
        lower.field_0 = local_1c8._0_8_;
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.
               bounds0.lower.field_0 + 8) = local_1c8._8_8_;
      *(undefined8 *)
       &(__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds0.
        upper.field_0 = local_1a8._0_8_;
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.
               bounds0.upper.field_0 + 8) = local_1a8._8_8_;
      (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds1.
      lower.field_0 = auVar52._0_16_;
      (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds1.
      upper.field_0 = auVar50._0_16_;
      (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).centBounds.lower.
      field_0 = auVar44._0_16_;
      (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).centBounds.upper.
      field_0 = auVar39._0_16_;
      (__return_storage_ptr__->object_range)._end = local_1b8._0_8_;
      __return_storage_ptr__->num_time_segments = local_1b8._8_8_;
      __return_storage_ptr__->max_num_time_segments = uVar17;
      auVar33 = vunpcklpd_avx(auVar37._0_16_,local_198);
      (__return_storage_ptr__->max_time_range).lower = (float)(int)auVar33._0_8_;
      (__return_storage_ptr__->max_time_range).upper = (float)(int)((ulong)auVar33._0_8_ >> 0x20);
      (__return_storage_ptr__->time_range).lower = (float)(int)auVar33._8_8_;
      (__return_storage_ptr__->time_range).upper = (float)(int)((ulong)auVar33._8_8_ >> 0x20);
      return __return_storage_ptr__;
    }
    BVar3 = (this->super_Points).super_Geometry.time_range;
    auVar33._8_8_ = 0;
    auVar33._0_4_ = BVar3.lower;
    auVar33._4_4_ = BVar3.upper;
    auVar33 = vmovshdup_avx(auVar33);
    fVar23 = BVar3.lower;
    fVar24 = auVar33._0_4_ - fVar23;
    pBVar4 = (this->super_Points).vertices.items;
    if ((uVar22 & 0xffffffff) < (pBVar4->super_RawBufferView).num) break;
LAB_00bf5620:
    uVar22 = uVar22 + 1;
  }
  fVar2 = (this->super_Points).super_Geometry.fnumTimeSegments;
  auVar33 = ZEXT416((uint)(fVar2 * ((t0t1->upper - fVar23) / fVar24) * 0.99999976));
  auVar33 = vroundss_avx(auVar33,auVar33,10);
  auVar26 = vminss_avx(auVar33,ZEXT416((uint)fVar2));
  fVar28 = (t0t1->lower - fVar23) / fVar24;
  auVar33 = ZEXT416((uint)(fVar2 * fVar28 * 1.0000002));
  auVar33 = vroundss_avx(auVar33,auVar33,9);
  auVar33 = vmaxss_avx(auVar48._0_16_,auVar33);
  psVar18 = &pBVar4[(int)auVar33._0_4_].super_RawBufferView.stride;
  uVar21 = (long)(int)auVar33._0_4_ - 1;
LAB_00bf55d6:
  uVar21 = uVar21 + 1;
  if ((ulong)(long)(int)auVar26._0_4_ < uVar21) {
    fVar24 = (t0t1->upper - fVar23) / fVar24;
    fVar23 = fVar2 * fVar28;
    fVar30 = fVar2 * fVar24;
    auVar29 = vroundss_avx(ZEXT416((uint)fVar23),ZEXT416((uint)fVar23),9);
    auVar31 = vroundss_avx(ZEXT416((uint)fVar30),ZEXT416((uint)fVar30),10);
    auVar33 = vmaxss_avx(auVar29,auVar48._0_16_);
    auVar26 = vminss_avx(auVar31,ZEXT416((uint)fVar2));
    iVar16 = (int)auVar33._0_4_;
    fVar27 = auVar26._0_4_;
    uVar13 = (uint)auVar29._0_4_;
    uVar14 = 0xffffffff;
    if (-1 < (int)uVar13) {
      uVar14 = uVar13;
    }
    puVar15 = &local_130;
    iVar11 = (int)fVar2 + 1;
    if ((int)auVar31._0_4_ < (int)fVar2 + 1) {
      iVar11 = (int)auVar31._0_4_;
    }
    local_140.this = &this->super_Points;
    local_140.primID = puVar15;
    local_130 = uVar22;
    Points::linearBounds::anon_class_16_2_4e716a3c::operator()(&blower0,&local_140,(long)iVar16);
    Points::linearBounds::anon_class_16_2_4e716a3c::operator()
              (&bupper1,&local_140,(long)(int)fVar27);
    fVar23 = fVar23 - auVar33._0_4_;
    if (iVar11 - uVar14 == 1) {
      auVar33 = vmaxss_avx(ZEXT416((uint)fVar23),ZEXT816(0) << 0x40);
      auVar26 = vshufps_avx(auVar33,auVar33,0);
      auVar33 = ZEXT416((uint)(1.0 - auVar33._0_4_));
      auVar33 = vshufps_avx(auVar33,auVar33,0);
      auVar43._0_4_ =
           auVar26._0_4_ * bupper1.lower.field_0.m128[0] +
           auVar33._0_4_ * blower0.lower.field_0.m128[0];
      auVar43._4_4_ =
           auVar26._4_4_ * bupper1.lower.field_0.m128[1] +
           auVar33._4_4_ * blower0.lower.field_0.m128[1];
      auVar43._8_4_ =
           auVar26._8_4_ * bupper1.lower.field_0.m128[2] +
           auVar33._8_4_ * blower0.lower.field_0.m128[2];
      auVar43._12_4_ =
           auVar26._12_4_ * bupper1.lower.field_0.m128[3] +
           auVar33._12_4_ * blower0.lower.field_0.m128[3];
      auVar38._0_4_ =
           auVar26._0_4_ * bupper1.upper.field_0.m128[0] +
           auVar33._0_4_ * blower0.upper.field_0.m128[0];
      auVar38._4_4_ =
           auVar26._4_4_ * bupper1.upper.field_0.m128[1] +
           auVar33._4_4_ * blower0.upper.field_0.m128[1];
      auVar38._8_4_ =
           auVar26._8_4_ * bupper1.upper.field_0.m128[2] +
           auVar33._8_4_ * blower0.upper.field_0.m128[2];
      auVar38._12_4_ =
           auVar26._12_4_ * bupper1.upper.field_0.m128[3] +
           auVar33._12_4_ * blower0.upper.field_0.m128[3];
      auVar33 = vmaxss_avx(ZEXT416((uint)(fVar27 - fVar30)),ZEXT816(0) << 0x40);
      auVar26 = vshufps_avx(auVar33,auVar33,0);
      auVar33 = ZEXT416((uint)(1.0 - auVar33._0_4_));
      auVar33 = vshufps_avx(auVar33,auVar33,0);
      auVar29._0_4_ =
           auVar33._0_4_ * bupper1.lower.field_0.m128[0] +
           auVar26._0_4_ * blower0.lower.field_0.m128[0];
      auVar29._4_4_ =
           auVar33._4_4_ * bupper1.lower.field_0.m128[1] +
           auVar26._4_4_ * blower0.lower.field_0.m128[1];
      auVar29._8_4_ =
           auVar33._8_4_ * bupper1.lower.field_0.m128[2] +
           auVar26._8_4_ * blower0.lower.field_0.m128[2];
      auVar29._12_4_ =
           auVar33._12_4_ * bupper1.lower.field_0.m128[3] +
           auVar26._12_4_ * blower0.lower.field_0.m128[3];
      auVar31._0_4_ =
           auVar33._0_4_ * bupper1.upper.field_0.m128[0] +
           auVar26._0_4_ * blower0.upper.field_0.m128[0];
      auVar31._4_4_ =
           auVar33._4_4_ * bupper1.upper.field_0.m128[1] +
           auVar26._4_4_ * blower0.upper.field_0.m128[1];
      auVar31._8_4_ =
           auVar33._8_4_ * bupper1.upper.field_0.m128[2] +
           auVar26._8_4_ * blower0.upper.field_0.m128[2];
      auVar31._12_4_ =
           auVar33._12_4_ * bupper1.upper.field_0.m128[3] +
           auVar26._12_4_ * blower0.upper.field_0.m128[3];
    }
    else {
      Points::linearBounds::anon_class_16_2_4e716a3c::operator()
                (&blower1,&local_140,(long)(iVar16 + 1));
      Points::linearBounds::anon_class_16_2_4e716a3c::operator()
                (&bupper0,&local_140,(long)((int)fVar27 + -1));
      auVar33 = vmaxss_avx(ZEXT416((uint)fVar23),ZEXT816(0) << 0x40);
      auVar26 = vshufps_avx(auVar33,auVar33,0);
      auVar33 = ZEXT416((uint)(1.0 - auVar33._0_4_));
      auVar33 = vshufps_avx(auVar33,auVar33,0);
      auVar43._0_4_ =
           auVar26._0_4_ * blower1.lower.field_0.m128[0] +
           auVar33._0_4_ * blower0.lower.field_0.m128[0];
      auVar43._4_4_ =
           auVar26._4_4_ * blower1.lower.field_0.m128[1] +
           auVar33._4_4_ * blower0.lower.field_0.m128[1];
      auVar43._8_4_ =
           auVar26._8_4_ * blower1.lower.field_0.m128[2] +
           auVar33._8_4_ * blower0.lower.field_0.m128[2];
      auVar43._12_4_ =
           auVar26._12_4_ * blower1.lower.field_0.m128[3] +
           auVar33._12_4_ * blower0.lower.field_0.m128[3];
      auVar38._0_4_ =
           auVar26._0_4_ * blower1.upper.field_0.m128[0] +
           auVar33._0_4_ * blower0.upper.field_0.m128[0];
      auVar38._4_4_ =
           auVar26._4_4_ * blower1.upper.field_0.m128[1] +
           auVar33._4_4_ * blower0.upper.field_0.m128[1];
      auVar38._8_4_ =
           auVar26._8_4_ * blower1.upper.field_0.m128[2] +
           auVar33._8_4_ * blower0.upper.field_0.m128[2];
      auVar38._12_4_ =
           auVar26._12_4_ * blower1.upper.field_0.m128[3] +
           auVar33._12_4_ * blower0.upper.field_0.m128[3];
      auVar33 = vmaxss_avx(ZEXT416((uint)(fVar27 - fVar30)),ZEXT816(0) << 0x40);
      auVar26 = vshufps_avx(auVar33,auVar33,0);
      auVar33 = ZEXT416((uint)(1.0 - auVar33._0_4_));
      auVar33 = vshufps_avx(auVar33,auVar33,0);
      auVar29._0_4_ =
           auVar26._0_4_ * bupper0.lower.field_0.m128[0] +
           auVar33._0_4_ * bupper1.lower.field_0.m128[0];
      auVar29._4_4_ =
           auVar26._4_4_ * bupper0.lower.field_0.m128[1] +
           auVar33._4_4_ * bupper1.lower.field_0.m128[1];
      auVar29._8_4_ =
           auVar26._8_4_ * bupper0.lower.field_0.m128[2] +
           auVar33._8_4_ * bupper1.lower.field_0.m128[2];
      auVar29._12_4_ =
           auVar26._12_4_ * bupper0.lower.field_0.m128[3] +
           auVar33._12_4_ * bupper1.lower.field_0.m128[3];
      auVar31._0_4_ =
           auVar26._0_4_ * bupper0.upper.field_0.m128[0] +
           auVar33._0_4_ * bupper1.upper.field_0.m128[0];
      auVar31._4_4_ =
           auVar26._4_4_ * bupper0.upper.field_0.m128[1] +
           auVar33._4_4_ * bupper1.upper.field_0.m128[1];
      auVar31._8_4_ =
           auVar26._8_4_ * bupper0.upper.field_0.m128[2] +
           auVar33._8_4_ * bupper1.upper.field_0.m128[2];
      auVar31._12_4_ =
           auVar26._12_4_ * bupper0.upper.field_0.m128[3] +
           auVar33._12_4_ * bupper1.upper.field_0.m128[3];
      puVar15 = (ulong *)(ulong)uVar13;
      if ((int)uVar13 < 0) {
        puVar15 = (ulong *)0xffffffff;
      }
      itime = (size_t)(int)puVar15;
      while (itime = itime + 1, (long)itime < (long)iVar11) {
        auVar26._0_4_ = ((float)(int)itime / fVar2 - fVar28) / (fVar24 - fVar28);
        auVar26._4_12_ = SUB6012((undefined1  [60])0x0,0);
        auVar33 = vshufps_avx(auVar26,auVar26,0);
        fVar23 = auVar29._4_4_;
        fVar30 = auVar29._8_4_;
        fVar27 = auVar29._12_4_;
        auVar26 = vshufps_avx(ZEXT416((uint)(1.0 - auVar26._0_4_)),
                              ZEXT416((uint)(1.0 - auVar26._0_4_)),0);
        fVar45 = auVar43._4_4_;
        fVar46 = auVar43._8_4_;
        fVar47 = auVar43._12_4_;
        fVar34 = auVar31._4_4_;
        fVar35 = auVar31._8_4_;
        fVar36 = auVar31._12_4_;
        fVar40 = auVar38._4_4_;
        fVar41 = auVar38._8_4_;
        fVar42 = auVar38._12_4_;
        Points::linearBounds::anon_class_16_2_4e716a3c::operator()(&bi,&local_140,itime);
        auVar10._4_4_ = fVar23 * auVar33._4_4_ + fVar45 * auVar26._4_4_;
        auVar10._0_4_ = auVar29._0_4_ * auVar33._0_4_ + auVar43._0_4_ * auVar26._0_4_;
        auVar10._8_4_ = fVar30 * auVar33._8_4_ + fVar46 * auVar26._8_4_;
        auVar10._12_4_ = fVar27 * auVar33._12_4_ + fVar47 * auVar26._12_4_;
        auVar10 = vsubps_avx((undefined1  [16])bi.lower.field_0,auVar10);
        auVar12._4_4_ = fVar34 * auVar33._4_4_ + fVar40 * auVar26._4_4_;
        auVar12._0_4_ = auVar31._0_4_ * auVar33._0_4_ + auVar38._0_4_ * auVar26._0_4_;
        auVar12._8_4_ = fVar35 * auVar33._8_4_ + fVar41 * auVar26._8_4_;
        auVar12._12_4_ = fVar36 * auVar33._12_4_ + fVar42 * auVar26._12_4_;
        auVar33 = vsubps_avx((undefined1  [16])bi.upper.field_0,auVar12);
        auVar26 = vminps_avx(auVar10,ZEXT816(0) << 0x40);
        auVar33 = vmaxps_avx(auVar33,ZEXT816(0) << 0x40);
        auVar43._0_4_ = auVar43._0_4_ + auVar26._0_4_;
        auVar43._4_4_ = fVar45 + auVar26._4_4_;
        auVar43._8_4_ = fVar46 + auVar26._8_4_;
        auVar43._12_4_ = fVar47 + auVar26._12_4_;
        auVar29._0_4_ = auVar29._0_4_ + auVar26._0_4_;
        auVar29._4_4_ = fVar23 + auVar26._4_4_;
        auVar29._8_4_ = fVar30 + auVar26._8_4_;
        auVar29._12_4_ = fVar27 + auVar26._12_4_;
        auVar38._0_4_ = auVar38._0_4_ + auVar33._0_4_;
        auVar38._4_4_ = fVar40 + auVar33._4_4_;
        auVar38._8_4_ = fVar41 + auVar33._8_4_;
        auVar38._12_4_ = fVar42 + auVar33._12_4_;
        auVar31._0_4_ = auVar31._0_4_ + auVar33._0_4_;
        auVar31._4_4_ = fVar34 + auVar33._4_4_;
        auVar31._8_4_ = fVar35 + auVar33._8_4_;
        auVar31._12_4_ = fVar36 + auVar33._12_4_;
      }
    }
    auVar48 = ZEXT1664(ZEXT816(0) << 0x40);
    aVar6 = (anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1)
            vinsertps_avx(auVar43,ZEXT416(geomID),0x30);
    uVar14 = (this->super_Points).super_Geometry.numTimeSteps - 1;
    uVar21 = (ulong)uVar14;
    BVar3 = (this->super_Points).super_Geometry.time_range;
    auVar25._8_8_ = 0;
    auVar25._0_4_ = BVar3.lower;
    auVar25._4_4_ = BVar3.upper;
    aVar7 = (anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1)
            vinsertps_avx(auVar38,ZEXT416((uint)uVar22),0x30);
    aVar8 = (anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1)
            vinsertps_avx(auVar29,ZEXT416(uVar14),0x30);
    aVar9 = (anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1)
            vinsertps_avx(auVar31,ZEXT416(uVar14),0x30);
    auVar26 = vcmpps_avx(local_198,auVar25,1);
    auVar29 = vinsertps_avx(local_198,auVar25,0x50);
    auVar33 = vblendps_avx(auVar25,local_198,2);
    local_198 = vblendvps_avx(auVar33,auVar29,auVar26);
    auVar32._0_4_ = aVar6.x * 0.5 + aVar8.x * 0.5 + aVar7.x * 0.5 + aVar9.x * 0.5;
    auVar32._4_4_ = aVar6.y * 0.5 + aVar8.y * 0.5 + aVar7.y * 0.5 + aVar9.y * 0.5;
    auVar32._8_4_ = aVar6.z * 0.5 + aVar8.z * 0.5 + aVar7.z * 0.5 + aVar9.z * 0.5;
    auVar32._12_4_ =
         aVar6.field_3.w * 0.5 + aVar8.field_3.w * 0.5 +
         aVar7.field_3.w * 0.5 + aVar9.field_3.w * 0.5;
    auVar33 = vminps_avx((undefined1  [16])auVar44._0_16_,auVar32);
    auVar44 = ZEXT1664(auVar33);
    auVar33 = vmaxps_avx((undefined1  [16])auVar39._0_16_,auVar32);
    auVar39 = ZEXT1664(auVar33);
    auVar33 = vpshufd_avx(ZEXT416((uint)CONCAT71((int7)((ulong)puVar15 >> 8),uVar17 < uVar21)),0x50)
    ;
    auVar33 = vpslld_avx(auVar33,0x1f);
    auVar33 = vblendvps_avx(auVar37._0_16_,auVar25,auVar33);
    auVar37 = ZEXT1664(auVar33);
    auVar33 = vpmovsxbq_avx(ZEXT216(0x101));
    auVar33 = vpinsrq_avx(auVar33,uVar21,1);
    local_1b8 = vpaddq_avx(local_1b8,auVar33);
    if (uVar17 <= uVar21) {
      uVar17 = uVar21;
    }
    local_1c8 = vminps_avx(local_1c8,(undefined1  [16])aVar6);
    pPVar5 = prims->items;
    pPVar5[k].lbounds.bounds0.lower.field_0.field_1 = aVar6;
    local_1a8 = vmaxps_avx(local_1a8,(undefined1  [16])aVar7);
    pPVar5[k].lbounds.bounds0.upper.field_0.field_1 = aVar7;
    auVar33 = vminps_avx((undefined1  [16])auVar52._0_16_,(undefined1  [16])aVar8);
    auVar52 = ZEXT1664(auVar33);
    pPVar5[k].lbounds.bounds1.lower.field_0.field_1 = aVar8;
    auVar33 = vmaxps_avx((undefined1  [16])auVar50._0_16_,(undefined1  [16])aVar9);
    auVar50 = ZEXT1664(auVar33);
    pPVar5[k].lbounds.bounds1.upper.field_0.field_1 = aVar9;
    pPVar5[k].time_range = BVar3;
    k = k + 1;
    auVar49 = ZEXT1664(CONCAT412(0xddccb9a2,CONCAT48(0xddccb9a2,0xddccb9a2ddccb9a2)));
    auVar51 = ZEXT1664(CONCAT412(0x5dccb9a2,CONCAT48(0x5dccb9a2,0x5dccb9a25dccb9a2)));
  }
  else {
    pRVar1 = (RawBufferView *)(psVar18 + -2);
    lVar20 = *psVar18 * (uVar22 & 0xffffffff);
    if (0.0 <= *(float *)(pRVar1->ptr_ofs + lVar20 + 0xc)) goto code_r0x00bf55f2;
  }
  goto LAB_00bf5620;
code_r0x00bf55f2:
  psVar18 = psVar18 + 7;
  auVar33 = *(undefined1 (*) [16])(pRVar1->ptr_ofs + lVar20);
  auVar29 = vcmpps_avx(auVar33,auVar49._0_16_,2);
  auVar33 = vcmpps_avx(auVar33,auVar51._0_16_,5);
  auVar33 = vorps_avx(auVar29,auVar33);
  uVar19 = vmovmskps_avx(auVar33);
  if ((char)uVar19 != '\0') goto LAB_00bf5620;
  goto LAB_00bf55d6;
}

Assistant:

PrimInfoMB createPrimRefMBArray(mvector<PrimRefMB>& prims,
                                      const BBox1f& t0t1,
                                      const range<size_t>& r,
                                      size_t k,
                                      unsigned int geomID) const
      {
        PrimInfoMB pinfo(empty);
        for (size_t j = r.begin(); j < r.end(); j++) {
          if (!valid(j, timeSegmentRange(t0t1)))
            continue;
          const PrimRefMB prim(linearBounds(j, t0t1), this->numTimeSegments(), this->time_range, this->numTimeSegments(), geomID, unsigned(j));
          pinfo.add_primref(prim);
          prims[k++] = prim;
        }
        return pinfo;
      }